

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tf_decode_data.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::DecodeDataBuilder::Push
          (DecodeDataBuilder *this)

{
  byte bVar1;
  byte bVar2;
  
  bVar1 = this->op_ | (byte)this->segment_len_;
  bVar2 = bVar1 | 0x80;
  if (this->need_underscore_ == false) {
    bVar2 = bVar1;
  }
  if (bVar2 != 0) {
    std::__cxx11::string::push_back((char)this + '\b');
  }
  this->need_underscore_ = false;
  this->is_all_upper_ = true;
  this->op_ = '\0';
  this->segment_len_ = 0;
  return;
}

Assistant:

void Push() {
    uint8_t op = (op_ | segment_len_);
    if (need_underscore_) op |= kAddUnderscore;
    if (op != 0) {
      decode_data_ += (char)op;
    }
    Reset();
  }